

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::full_formatter::format
          (full_formatter *this,log_msg *msg,tm *tm_time,memory_buf_t *dest)

{
  memory_buf_t *this_00;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  format_handler<char> *pfVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  long lVar8;
  char *pcVar9;
  size_t sVar10;
  mdc_map_t *mdc_map;
  buffer<char> *buf_4;
  ulong uVar11;
  uint uVar12;
  char *buf_ptr_2;
  char *__s;
  basic_string_view<char> fmt;
  basic_string_view<char> fmt_00;
  basic_string_view<char> fmt_01;
  basic_string_view<char> fmt_02;
  basic_string_view<char> fmt_03;
  buffer<char> *buf;
  uint local_78 [4];
  char *local_68;
  undefined8 local_60;
  undefined4 local_58;
  char local_53 [3];
  memory_buf_t *local_50;
  undefined8 local_48;
  uint *local_40;
  undefined8 local_38;
  
  lVar8 = (msg->time).__d.__r / 1000000000;
  if (((this->cache_timestamp_).__r != lVar8) ||
     ((this->cached_datetime_).super_buffer<char>.size_ == 0)) {
    this_00 = &this->cached_datetime_;
    (this->cached_datetime_).super_buffer<char>.size_ = 0;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ == 0) {
      (*(this->cached_datetime_).super_buffer<char>.grow_)(&this_00->super_buffer<char>,1);
    }
    pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
    sVar3 = (this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ = sVar3 + 1;
    pcVar2[sVar3] = '[';
    iVar1 = tm_time->tm_year;
    uVar12 = iVar1 + 0x76c;
    uVar7 = -uVar12;
    if (0 < (int)uVar12) {
      uVar7 = uVar12;
    }
    local_50 = (memory_buf_t *)
               ::fmt::v11::detail::do_format_decimal<char,unsigned_int>
                         ((char *)&local_68,uVar7,0x15);
    if (iVar1 < -0x76c) {
      *(char *)((long)(local_50 + -1) + 0x11f) = '-';
      local_50 = (memory_buf_t *)((long)(local_50 + -1) + 0x11f);
    }
    ::fmt::v11::detail::buffer<char>::append<char>
              (&this_00->super_buffer<char>,(char *)local_50,local_53);
    uVar11 = (this->cached_datetime_).super_buffer<char>.size_ + 1;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar11) {
      (*(this->cached_datetime_).super_buffer<char>.grow_)(&this_00->super_buffer<char>,uVar11);
    }
    pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
    pfVar4 = (format_handler<char> *)(this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ =
         (size_t)((long)&(pfVar4->parse_ctx).fmt_.data_ + 1);
    pcVar2[(long)&(pfVar4->parse_ctx).fmt_.data_] = '-';
    uVar12 = tm_time->tm_mon + 1;
    if (uVar12 < 100) {
      uVar11 = (this->cached_datetime_).super_buffer<char>.size_ + 1;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar11) {
        (*(this->cached_datetime_).super_buffer<char>.grow_)(&this_00->super_buffer<char>,uVar11);
      }
      pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar3 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar3 + 1;
      pcVar2[sVar3] = (byte)(uVar12 / 10) | 0x30;
      uVar11 = (this->cached_datetime_).super_buffer<char>.size_ + 1;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar11) {
        (*(this->cached_datetime_).super_buffer<char>.grow_)(&this_00->super_buffer<char>,uVar11);
      }
      pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar3 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar3 + 1;
      pcVar2[sVar3] = (char)uVar12 + (char)(uVar12 / 10) * -10 | 0x30;
    }
    else {
      local_40 = local_78;
      local_68 = "{:02}";
      local_60 = 5;
      local_58 = 0;
      local_48 = 1;
      local_38 = 0;
      fmt.size_ = (size_t)&local_68;
      fmt.data_ = (char *)0x5;
      local_78[0] = uVar12;
      local_50 = this_00;
      ::fmt::v11::detail::parse_format_string<char,fmt::v11::detail::format_handler<char>>
                ((detail *)"{:02}",fmt,pfVar4);
    }
    uVar11 = (this->cached_datetime_).super_buffer<char>.size_ + 1;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar11) {
      (*(this->cached_datetime_).super_buffer<char>.grow_)(&this_00->super_buffer<char>,uVar11);
    }
    pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
    pfVar4 = (format_handler<char> *)(this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ =
         (size_t)((long)&(pfVar4->parse_ctx).fmt_.data_ + 1);
    pcVar2[(long)&(pfVar4->parse_ctx).fmt_.data_] = '-';
    uVar12 = tm_time->tm_mday;
    if (uVar12 < 100) {
      uVar11 = (this->cached_datetime_).super_buffer<char>.size_ + 1;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar11) {
        (*(this->cached_datetime_).super_buffer<char>.grow_)(&this_00->super_buffer<char>,uVar11);
      }
      pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar3 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar3 + 1;
      pcVar2[sVar3] = (byte)(uVar12 / 10) | 0x30;
      uVar11 = (this->cached_datetime_).super_buffer<char>.size_ + 1;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar11) {
        (*(this->cached_datetime_).super_buffer<char>.grow_)(&this_00->super_buffer<char>,uVar11);
      }
      pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar3 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar3 + 1;
      pcVar2[sVar3] = (char)uVar12 + (char)(uVar12 / 10) * -10 | 0x30;
    }
    else {
      local_40 = local_78;
      local_68 = "{:02}";
      local_60 = 5;
      local_58 = 0;
      local_48 = 1;
      local_38 = 0;
      fmt_00.size_ = (size_t)&local_68;
      fmt_00.data_ = (char *)0x5;
      local_78[0] = uVar12;
      local_50 = this_00;
      ::fmt::v11::detail::parse_format_string<char,fmt::v11::detail::format_handler<char>>
                ((detail *)"{:02}",fmt_00,pfVar4);
    }
    uVar11 = (this->cached_datetime_).super_buffer<char>.size_ + 1;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar11) {
      (*(this->cached_datetime_).super_buffer<char>.grow_)(&this_00->super_buffer<char>,uVar11);
    }
    pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
    pfVar4 = (format_handler<char> *)(this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ =
         (size_t)((long)&(pfVar4->parse_ctx).fmt_.data_ + 1);
    pcVar2[(long)&(pfVar4->parse_ctx).fmt_.data_] = ' ';
    uVar12 = tm_time->tm_hour;
    if (uVar12 < 100) {
      uVar11 = (this->cached_datetime_).super_buffer<char>.size_ + 1;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar11) {
        (*(this->cached_datetime_).super_buffer<char>.grow_)(&this_00->super_buffer<char>,uVar11);
      }
      pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar3 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar3 + 1;
      pcVar2[sVar3] = (byte)(uVar12 / 10) | 0x30;
      uVar11 = (this->cached_datetime_).super_buffer<char>.size_ + 1;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar11) {
        (*(this->cached_datetime_).super_buffer<char>.grow_)(&this_00->super_buffer<char>,uVar11);
      }
      pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar3 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar3 + 1;
      pcVar2[sVar3] = (char)uVar12 + (char)(uVar12 / 10) * -10 | 0x30;
    }
    else {
      local_40 = local_78;
      local_68 = "{:02}";
      local_60 = 5;
      local_58 = 0;
      local_48 = 1;
      local_38 = 0;
      fmt_01.size_ = (size_t)&local_68;
      fmt_01.data_ = (char *)0x5;
      local_78[0] = uVar12;
      local_50 = this_00;
      ::fmt::v11::detail::parse_format_string<char,fmt::v11::detail::format_handler<char>>
                ((detail *)"{:02}",fmt_01,pfVar4);
    }
    uVar11 = (this->cached_datetime_).super_buffer<char>.size_ + 1;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar11) {
      (*(this->cached_datetime_).super_buffer<char>.grow_)(&this_00->super_buffer<char>,uVar11);
    }
    pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
    pfVar4 = (format_handler<char> *)(this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ =
         (size_t)((long)&(pfVar4->parse_ctx).fmt_.data_ + 1);
    pcVar2[(long)&(pfVar4->parse_ctx).fmt_.data_] = ':';
    uVar12 = tm_time->tm_min;
    if (uVar12 < 100) {
      uVar11 = (this->cached_datetime_).super_buffer<char>.size_ + 1;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar11) {
        (*(this->cached_datetime_).super_buffer<char>.grow_)(&this_00->super_buffer<char>,uVar11);
      }
      pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar3 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar3 + 1;
      pcVar2[sVar3] = (byte)(uVar12 / 10) | 0x30;
      uVar11 = (this->cached_datetime_).super_buffer<char>.size_ + 1;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar11) {
        (*(this->cached_datetime_).super_buffer<char>.grow_)(&this_00->super_buffer<char>,uVar11);
      }
      pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar3 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar3 + 1;
      pcVar2[sVar3] = (char)uVar12 + (char)(uVar12 / 10) * -10 | 0x30;
    }
    else {
      local_40 = local_78;
      local_68 = "{:02}";
      local_60 = 5;
      local_58 = 0;
      local_48 = 1;
      local_38 = 0;
      fmt_02.size_ = (size_t)&local_68;
      fmt_02.data_ = (char *)0x5;
      local_78[0] = uVar12;
      local_50 = this_00;
      ::fmt::v11::detail::parse_format_string<char,fmt::v11::detail::format_handler<char>>
                ((detail *)"{:02}",fmt_02,pfVar4);
    }
    uVar11 = (this->cached_datetime_).super_buffer<char>.size_ + 1;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar11) {
      (*(this->cached_datetime_).super_buffer<char>.grow_)(&this_00->super_buffer<char>,uVar11);
    }
    pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
    pfVar4 = (format_handler<char> *)(this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ =
         (size_t)((long)&(pfVar4->parse_ctx).fmt_.data_ + 1);
    pcVar2[(long)&(pfVar4->parse_ctx).fmt_.data_] = ':';
    uVar12 = tm_time->tm_sec;
    if (uVar12 < 100) {
      uVar11 = (this->cached_datetime_).super_buffer<char>.size_ + 1;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar11) {
        (*(this->cached_datetime_).super_buffer<char>.grow_)(&this_00->super_buffer<char>,uVar11);
      }
      pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar3 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar3 + 1;
      pcVar2[sVar3] = (byte)(uVar12 / 10) | 0x30;
      uVar11 = (this->cached_datetime_).super_buffer<char>.size_ + 1;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar11) {
        (*(this->cached_datetime_).super_buffer<char>.grow_)(&this_00->super_buffer<char>,uVar11);
      }
      pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar3 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar3 + 1;
      pcVar2[sVar3] = (char)uVar12 + (char)(uVar12 / 10) * -10 | 0x30;
    }
    else {
      local_40 = local_78;
      local_68 = "{:02}";
      local_60 = 5;
      local_58 = 0;
      local_48 = 1;
      local_38 = 0;
      fmt_03.size_ = (size_t)&local_68;
      fmt_03.data_ = (char *)0x5;
      local_78[0] = uVar12;
      local_50 = this_00;
      ::fmt::v11::detail::parse_format_string<char,fmt::v11::detail::format_handler<char>>
                ((detail *)"{:02}",fmt_03,pfVar4);
    }
    uVar11 = (this->cached_datetime_).super_buffer<char>.size_ + 1;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar11) {
      (*(this->cached_datetime_).super_buffer<char>.grow_)(&this_00->super_buffer<char>,uVar11);
    }
    pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
    sVar3 = (this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ = sVar3 + 1;
    pcVar2[sVar3] = '.';
    (this->cache_timestamp_).__r = lVar8;
  }
  pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
  ::fmt::v11::detail::buffer<char>::append<char>
            (&dest->super_buffer<char>,pcVar2,
             pcVar2 + (this->cached_datetime_).super_buffer<char>.size_);
  lVar8 = (msg->time).__d.__r;
  auVar5 = SEXT816(lVar8) * SEXT816(0x112e0be826d694b3);
  auVar6 = SEXT816(lVar8) * SEXT816(0x431bde82d7b634db);
  fmt_helper::pad3<unsigned_int>
            (((int)(auVar5._8_8_ >> 0x1a) - (auVar5._12_4_ >> 0x1f)) * -1000 +
             ((int)(auVar6._8_8_ >> 0x12) - (auVar6._12_4_ >> 0x1f)),dest);
  uVar11 = (dest->super_buffer<char>).size_ + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar11) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar11);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar3 + 1;
  (dest->super_buffer<char>).ptr_[sVar3] = ']';
  uVar11 = (dest->super_buffer<char>).size_ + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar11) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar11);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar3 + 1;
  (dest->super_buffer<char>).ptr_[sVar3] = ' ';
  if ((msg->logger_name).size_ != 0) {
    uVar11 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar11) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar11);
    }
    sVar3 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar3 + 1;
    (dest->super_buffer<char>).ptr_[sVar3] = '[';
    pcVar2 = (msg->logger_name).data_;
    ::fmt::v11::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,pcVar2,pcVar2 + (msg->logger_name).size_);
    uVar11 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar11) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar11);
    }
    sVar3 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar3 + 1;
    (dest->super_buffer<char>).ptr_[sVar3] = ']';
    uVar11 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar11) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar11);
    }
    sVar3 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar3 + 1;
    (dest->super_buffer<char>).ptr_[sVar3] = ' ';
  }
  uVar11 = (dest->super_buffer<char>).size_ + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar11) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar11);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar3 + 1;
  (dest->super_buffer<char>).ptr_[sVar3] = '[';
  msg->color_range_start = (dest->super_buffer<char>).size_;
  lVar8 = (long)(int)msg->level * 0x10;
  ::fmt::v11::detail::buffer<char>::append<char>
            (&dest->super_buffer<char>,*(char **)(level::level_string_views + lVar8),
             *(char **)(level::level_string_views + lVar8) +
             *(long *)(level::level_string_views + lVar8 + 8));
  sVar3 = (dest->super_buffer<char>).size_;
  msg->color_range_end = sVar3;
  uVar11 = sVar3 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar11) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar11);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar3 + 1;
  (dest->super_buffer<char>).ptr_[sVar3] = ']';
  uVar11 = (dest->super_buffer<char>).size_ + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar11) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar11);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar3 + 1;
  (dest->super_buffer<char>).ptr_[sVar3] = ' ';
  if (0 < (msg->source).line) {
    uVar11 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar11) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar11);
    }
    sVar3 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar3 + 1;
    (dest->super_buffer<char>).ptr_[sVar3] = '[';
    pcVar2 = (msg->source).filename;
    pcVar9 = strrchr(pcVar2,0x2f);
    __s = pcVar9 + 1;
    if (pcVar9 == (char *)0x0) {
      __s = pcVar2;
    }
    sVar10 = strlen(__s);
    ::fmt::v11::detail::buffer<char>::append<char>(&dest->super_buffer<char>,__s,__s + sVar10);
    uVar11 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar11) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar11);
    }
    sVar3 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar3 + 1;
    (dest->super_buffer<char>).ptr_[sVar3] = ':';
    uVar12 = (msg->source).line;
    uVar7 = -uVar12;
    if (0 < (int)uVar12) {
      uVar7 = uVar12;
    }
    local_50 = (memory_buf_t *)
               ::fmt::v11::detail::do_format_decimal<char,unsigned_int>
                         ((char *)&local_68,uVar7,0x15);
    if ((int)uVar12 < 0) {
      *(char *)((long)(local_50 + -1) + 0x11f) = '-';
      local_50 = (memory_buf_t *)((long)(local_50 + -1) + 0x11f);
    }
    ::fmt::v11::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,(char *)local_50,local_53);
    uVar11 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar11) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar11);
    }
    sVar3 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar3 + 1;
    (dest->super_buffer<char>).ptr_[sVar3] = ']';
    uVar11 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar11) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar11);
    }
    sVar3 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar3 + 1;
    (dest->super_buffer<char>).ptr_[sVar3] = ' ';
  }
  mdc_map = mdc::get_context_abi_cxx11_();
  if ((mdc_map->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    uVar11 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar11) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar11);
    }
    sVar3 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar3 + 1;
    (dest->super_buffer<char>).ptr_[sVar3] = '[';
    mdc_formatter<spdlog::details::null_scoped_padder>::format_mdc
              (&this->mdc_formatter_,mdc_map,dest);
    uVar11 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar11) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar11);
    }
    sVar3 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar3 + 1;
    (dest->super_buffer<char>).ptr_[sVar3] = ']';
    uVar11 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar11) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar11);
    }
    sVar3 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar3 + 1;
    (dest->super_buffer<char>).ptr_[sVar3] = ' ';
  }
  pcVar2 = (msg->payload).data_;
  ::fmt::v11::detail::buffer<char>::append<char>
            (&dest->super_buffer<char>,pcVar2,pcVar2 + (msg->payload).size_);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &tm_time, memory_buf_t &dest) override {
        using std::chrono::duration_cast;
        using std::chrono::milliseconds;
        using std::chrono::seconds;

        // cache the date/time part for the next second.
        auto duration = msg.time.time_since_epoch();
        auto secs = duration_cast<seconds>(duration);

        if (cache_timestamp_ != secs || cached_datetime_.size() == 0) {
            cached_datetime_.clear();
            cached_datetime_.push_back('[');
            fmt_helper::append_int(tm_time.tm_year + 1900, cached_datetime_);
            cached_datetime_.push_back('-');

            fmt_helper::pad2(tm_time.tm_mon + 1, cached_datetime_);
            cached_datetime_.push_back('-');

            fmt_helper::pad2(tm_time.tm_mday, cached_datetime_);
            cached_datetime_.push_back(' ');

            fmt_helper::pad2(tm_time.tm_hour, cached_datetime_);
            cached_datetime_.push_back(':');

            fmt_helper::pad2(tm_time.tm_min, cached_datetime_);
            cached_datetime_.push_back(':');

            fmt_helper::pad2(tm_time.tm_sec, cached_datetime_);
            cached_datetime_.push_back('.');

            cache_timestamp_ = secs;
        }
        dest.append(cached_datetime_.begin(), cached_datetime_.end());

        auto millis = fmt_helper::time_fraction<milliseconds>(msg.time);
        fmt_helper::pad3(static_cast<uint32_t>(millis.count()), dest);
        dest.push_back(']');
        dest.push_back(' ');

        // append logger name if exists
        if (msg.logger_name.size() > 0) {
            dest.push_back('[');
            fmt_helper::append_string_view(msg.logger_name, dest);
            dest.push_back(']');
            dest.push_back(' ');
        }

        dest.push_back('[');
        // wrap the level name with color
        msg.color_range_start = dest.size();
        // fmt_helper::append_string_view(level::to_c_str(msg.level), dest);
        fmt_helper::append_string_view(level::to_string_view(msg.level), dest);
        msg.color_range_end = dest.size();
        dest.push_back(']');
        dest.push_back(' ');

        // add source location if present
        if (!msg.source.empty()) {
            dest.push_back('[');
            const char *filename =
                details::short_filename_formatter<details::null_scoped_padder>::basename(
                    msg.source.filename);
            fmt_helper::append_string_view(filename, dest);
            dest.push_back(':');
            fmt_helper::append_int(msg.source.line, dest);
            dest.push_back(']');
            dest.push_back(' ');
        }

#ifndef SPDLOG_NO_TLS
        // add mdc if present
        auto &mdc_map = mdc::get_context();
        if (!mdc_map.empty()) {
            dest.push_back('[');
            mdc_formatter_.format_mdc(mdc_map, dest);
            dest.push_back(']');
            dest.push_back(' ');
        }
#endif
        // fmt_helper::append_string_view(msg.msg(), dest);
        fmt_helper::append_string_view(msg.payload, dest);
    }